

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

void sexp_shrink_bcode(sexp ctx,sexp_uint_t i)

{
  sexp psVar1;
  sexp_uint_t in_RSI;
  size_t in_RDI;
  sexp tmp;
  
  if ((*(sexp_uint_t *)(*(long *)(*(long *)(in_RDI + 0x50) + 0x10) + 0x20) != in_RSI) &&
     ((psVar1 = sexp_alloc_tagged_aux(tmp,in_RDI,in_RSI), ((ulong)psVar1 & 3) != 0 ||
      (psVar1->tag != 0x13)))) {
    (psVar1->value).flonum = *(double *)(*(long *)(*(long *)(in_RDI + 0x50) + 0x10) + 8);
    (psVar1->value).bytecode.length = in_RSI;
    (psVar1->value).type.cpl = *(sexp *)(*(long *)(*(long *)(in_RDI + 0x50) + 0x10) + 0x10);
    (psVar1->value).type.slots = *(sexp *)(*(long *)(*(long *)(in_RDI + 0x50) + 0x10) + 0x18);
    memcpy((void *)((long)&psVar1->value + 0x28),
           (void *)(*(long *)(*(long *)(in_RDI + 0x50) + 0x10) + 0x30),in_RSI);
    *(sexp *)(*(long *)(in_RDI + 0x50) + 0x10) = psVar1;
  }
  return;
}

Assistant:

void sexp_shrink_bcode (sexp ctx, sexp_uint_t i) {
  sexp tmp;
  if (sexp_bytecode_length(sexp_context_bc(ctx)) != i) {
    tmp = sexp_alloc_bytecode(ctx, i);
    if (!sexp_exceptionp(tmp)) {
      sexp_bytecode_name(tmp) = sexp_bytecode_name(sexp_context_bc(ctx));
      sexp_bytecode_length(tmp) = i;
      sexp_bytecode_literals(tmp)
        = sexp_bytecode_literals(sexp_context_bc(ctx));
      sexp_bytecode_source(tmp)
        = sexp_bytecode_source(sexp_context_bc(ctx));
      memcpy(sexp_bytecode_data(tmp),
             sexp_bytecode_data(sexp_context_bc(ctx)),
             i);
      sexp_context_bc(ctx) = tmp;
    }
  }
}